

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::MarkObjectSlots_TTD
          (PathTypeHandlerBase *this,SnapshotExtractor *extractor,DynamicObject *obj)

{
  bool bVar1;
  uint16 uVar2;
  int iVar3;
  PropertyId pid_00;
  undefined4 extraout_var;
  TypePath *this_00;
  PropertyRecord *this_01;
  Var var;
  byte local_51;
  Var value;
  uint uStack_34;
  ObjectSlotAttributes attr;
  PropertyId pid;
  uint32 index;
  ObjectSlotAttributes *attributes;
  uint32 plength;
  DynamicObject *obj_local;
  SnapshotExtractor *extractor_local;
  PathTypeHandlerBase *this_local;
  
  uVar2 = GetPathLength(this);
  iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  for (uStack_34 = 0; uStack_34 < uVar2; uStack_34 = uStack_34 + 1) {
    this_00 = GetTypePath(this);
    this_01 = TypePath::GetPropertyIdUnchecked(this_00,uStack_34);
    pid_00 = PropertyRecord::GetPropertyId(this_01);
    if (CONCAT44(extraout_var,iVar3) == 0) {
      local_51 = 0;
    }
    else {
      local_51 = *(byte *)(CONCAT44(extraout_var,iVar3) + (ulong)uStack_34);
    }
    bVar1 = DynamicTypeHandler::ShouldMarkPropertyId_TTD(pid_00);
    if ((bVar1) && ((local_51 & 8) == 0)) {
      var = DynamicObject::GetSlot(obj,uStack_34);
      TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::MarkObjectSlots_TTD(TTD::SnapshotExtractor* extractor, DynamicObject* obj) const
    {
        uint32 plength = this->GetPathLength();
        ObjectSlotAttributes * attributes = this->GetAttributeArray();

        for(uint32 index = 0; index < plength; ++index)
        {
            Js::PropertyId pid = GetTypePath()->GetPropertyIdUnchecked(index)->GetPropertyId();
            ObjectSlotAttributes attr = attributes ? attributes[index] : ObjectSlotAttr_Default;

            if (!DynamicTypeHandler::ShouldMarkPropertyId_TTD(pid) || (attr & ObjectSlotAttr_Deleted))
            {
                continue;
            }

            Js::Var value = obj->GetSlot(index);
            extractor->MarkVisitVar(value);
        }
    }